

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QDockAreaLayoutInfo * __thiscall QDockWidgetGroupWindow::tabLayoutInfo(QDockWidgetGroupWindow *this)

{
  bool bVar1;
  bool bVar2;
  QLayout *pQVar3;
  QDockAreaLayoutInfo *pQVar4;
  long lVar5;
  QDockAreaLayoutInfo *pQVar6;
  QDockAreaLayoutItem *item;
  QDockAreaLayoutItem *this_00;
  
  pQVar3 = QWidget::layout((QWidget *)this);
  pQVar6 = (QDockAreaLayoutInfo *)&pQVar3[4].super_QLayoutItem;
  do {
    pQVar4 = pQVar6;
    if (pQVar4 == (QDockAreaLayoutInfo *)0x0) {
      return (QDockAreaLayoutInfo *)0x0;
    }
    if (pQVar4->tabbed != false) {
      return pQVar4;
    }
    lVar5 = (pQVar4->item_list).d.size;
    if (lVar5 == 0) {
      bVar1 = false;
      pQVar6 = (QDockAreaLayoutInfo *)0x0;
    }
    else {
      this_00 = (pQVar4->item_list).d.ptr;
      lVar5 = lVar5 * 0x28;
      bVar1 = false;
      pQVar6 = (QDockAreaLayoutInfo *)0x0;
      do {
        bVar2 = QDockAreaLayoutItem::skip(this_00);
        if ((!bVar2) && ((this_00->flags & 1) == 0)) {
          if (pQVar6 != (QDockAreaLayoutInfo *)0x0) {
            return (QDockAreaLayoutInfo *)0x0;
          }
          if (bVar1) {
            return (QDockAreaLayoutInfo *)0x0;
          }
          pQVar6 = this_00->subinfo;
          if (pQVar6 == (QDockAreaLayoutInfo *)0x0) {
            if (this_00->widgetItem != (QLayoutItem *)0x0) {
              bVar1 = true;
            }
            pQVar6 = (QDockAreaLayoutInfo *)0x0;
          }
        }
        this_00 = this_00 + 1;
        lVar5 = lVar5 + -0x28;
      } while (lVar5 != 0);
    }
    if (bVar1) {
      return pQVar4;
    }
  } while( true );
}

Assistant:

QDockAreaLayoutInfo *QDockWidgetGroupWindow::layoutInfo() const
{
    return static_cast<QDockWidgetGroupLayout *>(layout())->dockAreaLayoutInfo();
}